

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XSObjectFactory::buildChoiceSequenceParticles
          (XSObjectFactory *this,ContentSpecNode *rootNode,XSParticleList *particleList,
          XSModel *xsModel)

{
  NodeTypes NVar1;
  XMLSize_t XVar2;
  XSParticle *pXVar3;
  
  if (rootNode != (ContentSpecNode *)0x0) {
    do {
      NVar1 = rootNode->fType;
      if ((NVar1 & ~ZeroOrOne) != Choice) {
        if (((NVar1 & (Any_NS|Any)) == Any) ||
           (NVar1 == Any_NS_Choice || (NVar1 & (Any_NS|Any_Other)) == Any_NS)) {
          pXVar3 = createWildcardParticle(this,rootNode,xsModel);
        }
        else if (NVar1 == Leaf) {
          pXVar3 = createElementParticle(this,rootNode,xsModel);
        }
        else {
          pXVar3 = createModelGroupParticle(this,rootNode,xsModel);
        }
        if (pXVar3 == (XSParticle *)0x0) {
          return;
        }
        BaseRefVectorOf<xercesc_4_0::XSParticle>::ensureExtraCapacity
                  (&particleList->super_BaseRefVectorOf<xercesc_4_0::XSParticle>,1);
        XVar2 = (particleList->super_BaseRefVectorOf<xercesc_4_0::XSParticle>).fCurCount;
        (particleList->super_BaseRefVectorOf<xercesc_4_0::XSParticle>).fElemList[XVar2] = pXVar3;
        (particleList->super_BaseRefVectorOf<xercesc_4_0::XSParticle>).fCurCount = XVar2 + 1;
        return;
      }
      buildChoiceSequenceParticles(this,rootNode->fFirst,particleList,xsModel);
      rootNode = rootNode->fSecond;
    } while (rootNode != (ContentSpecNode *)0x0);
  }
  return;
}

Assistant:

void XSObjectFactory::buildChoiceSequenceParticles(const ContentSpecNode* const rootNode,
                                            XSParticleList* const particleList,
                                            XSModel* const xsModel)
{
    if (rootNode)
    {
        const ContentSpecNode::NodeTypes nodeType = rootNode->getType();

        if (nodeType == ContentSpecNode::Sequence)
        {
            buildChoiceSequenceParticles(rootNode->getFirst(), particleList, xsModel);
            buildChoiceSequenceParticles(rootNode->getSecond(), particleList, xsModel);
        }
        else if (nodeType == ContentSpecNode::Choice)
        {
            buildChoiceSequenceParticles(rootNode->getFirst(), particleList, xsModel);
            buildChoiceSequenceParticles(rootNode->getSecond(), particleList, xsModel);
        }
        else if ((nodeType & 0x0f) == ContentSpecNode::Any
                 || (nodeType & 0x0f) == ContentSpecNode::Any_Other
                 || (nodeType & 0x0f) == ContentSpecNode::Any_NS
                 || nodeType == ContentSpecNode::Any_NS_Choice)
        {
            XSParticle* wildcardParticle = createWildcardParticle(rootNode, xsModel);
            if (wildcardParticle)
                particleList->addElement(wildcardParticle);
        }
        else if (nodeType == ContentSpecNode::Leaf)
        {
            XSParticle* elemParticle = createElementParticle(rootNode, xsModel);
            if (elemParticle)
                particleList->addElement(elemParticle);
        }
        // must be a model group
        else
        {
            XSParticle* xsParticle = createModelGroupParticle(rootNode, xsModel);
            if (xsParticle)
                particleList->addElement(xsParticle);
        }
    }
}